

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  long lVar3;
  undefined1 n [16];
  string_view prefix;
  format_specs specs;
  long in_RDI;
  string_view sVar4;
  bin_writer<1> in_stack_00000000;
  int num_digits;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffffbc [12];
  internal *this_00;
  undefined8 uVar5;
  undefined1 in_stack_ffffffffffffffe8 [12];
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x24);
    *(uint *)(in_RDI + 0x24) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x20 + (ulong)uVar2) = uVar1;
  }
  this_00 = *(internal **)(in_RDI + 0x10);
  uVar5 = *(undefined8 *)(in_RDI + 0x18);
  n._8_8_ = in_stack_ffffffffffffff10;
  n._0_8_ = in_stack_ffffffffffffff08;
  count_digits<1u,unsigned__int128>(this_00,(unsigned___int128)n);
  sVar4 = get_prefix((int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_> *)0x27245f);
  lVar3 = *(long *)(in_RDI + 8);
  prefix._4_12_ = in_stack_ffffffffffffffbc;
  prefix.data_._0_4_ = *(undefined4 *)(lVar3 + 0x20);
  specs._8_8_ = this_00;
  specs.width = (int)sVar4.size_;
  specs.precision = (int)(sVar4.size_ >> 0x20);
  specs.fill.data_[1] = (int)uVar5;
  specs.fill.data_[2] = (int)((ulong)uVar5 >> 0x20);
  specs.fill.data_[3] = in_stack_ffffffffffffffe8._0_4_;
  specs.fill.data_[4] = in_stack_ffffffffffffffe8._4_4_;
  specs.fill.data_[5] = in_stack_ffffffffffffffe8._8_4_;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
            (*(basic_writer<fmt::v6::buffer_range<wchar_t>_> **)(lVar3 + 0x18),
             (int)((ulong)*(undefined8 *)(lVar3 + 0x10) >> 0x20),prefix,specs,in_stack_00000000);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }